

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_pow10.cpp
# Opt level: O3

void __thiscall sc_dt::scfx_pow10::scfx_pow10(scfx_pow10 *this)

{
  scfx_rep *this_00;
  int iVar1;
  word *pwVar2;
  long lVar3;
  scfx_rep *this_01;
  undefined1 local_48 [32];
  int local_28;
  
  this_00 = this->m_neg;
  lVar3 = 0;
  do {
    scfx_rep::scfx_rep((scfx_rep *)((long)&this->m_pos[0].m_mant.m_array + lVar3));
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x500);
  lVar3 = 0;
  this_01 = this_00;
  do {
    scfx_rep::scfx_rep(this_01);
    lVar3 = lVar3 + -0x28;
    this_01 = this_01 + 1;
  } while (lVar3 != -0x500);
  scfx_rep::scfx_rep((scfx_rep *)local_48,10.0);
  if ((scfx_pow10 *)local_48 != this) {
    iVar1 = this->m_pos[0].m_mant.m_size;
    if (iVar1 != local_48._8_4_) {
      scfx_mant::free_word(this->m_pos[0].m_mant.m_array,(long)iVar1);
      this->m_pos[0].m_mant.m_size = local_48._8_4_;
      pwVar2 = scfx_mant::alloc_word((long)(int)local_48._8_4_);
      this->m_pos[0].m_mant.m_array = pwVar2;
      iVar1 = this->m_pos[0].m_mant.m_size;
    }
    if (0 < iVar1) {
      pwVar2 = this->m_pos[0].m_mant.m_array;
      lVar3 = 0;
      do {
        pwVar2[lVar3] = *(word *)(local_48._0_8_ + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->m_pos[0].m_mant.m_size);
    }
    this->m_pos[0].m_wp = local_48._16_4_;
    this->m_pos[0].m_sign = local_48._20_4_;
    this->m_pos[0].m_state = local_48._24_4_;
    this->m_pos[0].m_msw = local_48._28_4_;
    this->m_pos[0].m_lsw = local_28;
    scfx_rep::round(this->m_pos,(double)local_48._16_8_);
  }
  if ((word *)local_48._0_8_ != (word *)0x0) {
    scfx_mant::free_word((word *)local_48._0_8_,(long)(int)local_48._8_4_);
  }
  scfx_rep::scfx_rep((scfx_rep *)local_48,0.1);
  if ((scfx_rep *)local_48 != this_00) {
    iVar1 = this->m_neg[0].m_mant.m_size;
    if (iVar1 != local_48._8_4_) {
      scfx_mant::free_word((this_00->m_mant).m_array,(long)iVar1);
      this->m_neg[0].m_mant.m_size = local_48._8_4_;
      pwVar2 = scfx_mant::alloc_word((long)(int)local_48._8_4_);
      this->m_neg[0].m_mant.m_array = pwVar2;
      iVar1 = this->m_neg[0].m_mant.m_size;
    }
    if (0 < iVar1) {
      pwVar2 = (this_00->m_mant).m_array;
      lVar3 = 0;
      do {
        pwVar2[lVar3] = *(word *)(local_48._0_8_ + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->m_neg[0].m_mant.m_size);
    }
    this->m_neg[0].m_wp = local_48._16_4_;
    this->m_neg[0].m_sign = local_48._20_4_;
    this->m_neg[0].m_state = local_48._24_4_;
    this->m_neg[0].m_msw = local_48._28_4_;
    this->m_neg[0].m_lsw = local_28;
    scfx_rep::round(this_00,(double)local_48._16_8_);
  }
  if ((word *)local_48._0_8_ != (word *)0x0) {
    scfx_mant::free_word((word *)local_48._0_8_,(long)(int)local_48._8_4_);
  }
  lVar3 = 0;
  do {
    if (*(int *)((long)&this->m_pos[1].m_mant.m_size + lVar3) != 4) {
      if (*(long *)((long)&this->m_pos[1].m_mant.m_array + lVar3) == 0) {
        *(undefined4 *)((long)&this->m_pos[1].m_mant.m_size + lVar3) = 4;
        pwVar2 = scfx_mant::alloc_word(4);
        *(word **)((long)&this->m_pos[1].m_mant.m_array + lVar3) = pwVar2;
      }
      else {
        pwVar2 = scfx_mant::alloc_word(4);
        scfx_mant::free_word
                  (*(word **)((long)&this->m_pos[1].m_mant.m_array + lVar3),
                   (long)*(int *)((long)&this->m_pos[1].m_mant.m_size + lVar3));
        *(word **)((long)&this->m_pos[1].m_mant.m_array + lVar3) = pwVar2;
        *(undefined4 *)((long)&this->m_pos[1].m_mant.m_size + lVar3) = 4;
      }
    }
    *(undefined4 *)((long)&this->m_pos[1].m_state + lVar3) = 2;
    if (*(int *)((long)&this->m_neg[1].m_mant.m_size + lVar3) != 4) {
      if (*(long *)((long)&this->m_neg[1].m_mant.m_array + lVar3) == 0) {
        *(undefined4 *)((long)&this->m_neg[1].m_mant.m_size + lVar3) = 4;
        pwVar2 = scfx_mant::alloc_word(4);
        *(word **)((long)&this->m_neg[1].m_mant.m_array + lVar3) = pwVar2;
      }
      else {
        pwVar2 = scfx_mant::alloc_word(4);
        scfx_mant::free_word
                  (*(word **)((long)&this->m_neg[1].m_mant.m_array + lVar3),
                   (long)*(int *)((long)&this->m_neg[1].m_mant.m_size + lVar3));
        *(word **)((long)&this->m_neg[1].m_mant.m_array + lVar3) = pwVar2;
        *(undefined4 *)((long)&this->m_neg[1].m_mant.m_size + lVar3) = 4;
      }
    }
    *(undefined4 *)((long)&this->m_neg[1].m_state + lVar3) = 2;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x4d8);
  return;
}

Assistant:

scfx_pow10::scfx_pow10()
{
    m_pos[0] = scfx_rep( 10.0 );
    m_neg[0] = scfx_rep( 0.1 );

    for( int i = 1; i < SCFX_POW10_TABLE_SIZE; i ++ )
    {
        m_pos[i].set_nan();
	m_neg[i].set_nan();
    }
}